

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

int log_add_callback(log_LogFn fn,void *udata,int level)

{
  long lVar1;
  undefined4 uStack_2c;
  int local_28;
  int i;
  int level_local;
  void *udata_local;
  log_LogFn fn_local;
  
  local_28 = 0;
  while( true ) {
    if (0x1f < local_28) {
      return -1;
    }
    if (L.callbacks[local_28].fn == (log_LogFn)0x0) break;
    local_28 = local_28 + 1;
  }
  lVar1 = (long)local_28;
  L.callbacks[lVar1].fn = fn;
  L.callbacks[lVar1].udata = udata;
  *(ulong *)&L.callbacks[lVar1].level = CONCAT44(uStack_2c,level);
  return 0;
}

Assistant:

int log_add_callback(log_LogFn fn, void *udata, int level) {
    for (int i = 0; i < MAX_CALLBACKS; i++) {
        if (!L.callbacks[i].fn) {
            L.callbacks[i] = (Callback){fn, udata, level};
            return 0;
        }
    }
    return -1;
}